

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_expression.c
# Opt level: O1

AST * parse_postfix_expression(Translation_Data *translation_data,Scope *scope)

{
  int iVar1;
  char cVar2;
  AST_Binary_Expression *id;
  AST *right;
  token *ptVar3;
  AST_Lvalue_Expression *right_00;
  AST_Function_Expression *pAVar4;
  AST_Error *pAVar5;
  AST_Type AVar6;
  
  id = (AST_Binary_Expression *)parse_primary_expression(translation_data,scope);
LAB_0014254a:
  do {
    while( true ) {
      if (translation_data->tokens->size == 0) {
        return (AST *)id;
      }
      iVar1 = *translation_data->tokens->first->data;
      if (iVar1 < 0x3d) break;
      if (iVar1 == 0x4d) {
        chomp(translation_data);
        cVar2 = check(translation_data,KW_ID,0);
        if (cVar2 != '\0') {
          ptVar3 = (token *)Queue_Pop(translation_data->tokens);
          right_00 = get_lvalue_expression_tree(ptVar3,scope);
          AVar6 = OP_MEMBER;
LAB_00142695:
          id = get_binary_expression_tree((AST *)id,(AST *)right_00,AVar6);
        }
      }
      else {
        if (iVar1 == 0x3e) {
          chomp(translation_data);
          AVar6 = OP_POSTFIX_DEC;
        }
        else {
          if (iVar1 != 0x3d) {
            return (AST *)id;
          }
          chomp(translation_data);
          AVar6 = OP_POSTFIX_INC;
        }
        id = (AST_Binary_Expression *)get_unary_expression_tree((AST *)id,AVar6);
      }
    }
    if (iVar1 == 0x2c) {
      chomp(translation_data);
      cVar2 = check(translation_data,KW_ID,0);
      if (cVar2 != '\0') {
        ptVar3 = (token *)Queue_Pop(translation_data->tokens);
        right_00 = get_lvalue_expression_tree(ptVar3,scope);
        AVar6 = OP_MEMBER_TROUGH_PTR;
        goto LAB_00142695;
      }
      goto LAB_0014254a;
    }
    if (iVar1 != 0x34) {
      if (iVar1 != 0x26) {
        return (AST *)id;
      }
      chomp(translation_data);
      pAVar4 = parse_arglist(translation_data,scope,(AST *)id);
      return (AST *)pAVar4;
    }
    chomp(translation_data);
    cVar2 = get_and_check(translation_data,KW_CLOSE_SQUARE);
    if (cVar2 != '\0') {
      right_00 = (AST_Lvalue_Expression *)0x0;
      AVar6 = OP_ARR_SUBSCRIPT;
      goto LAB_00142695;
    }
    right = parse_comma_expression(translation_data,scope);
    id = get_binary_expression_tree((AST *)id,right,OP_ARR_SUBSCRIPT);
    cVar2 = get_and_check(translation_data,KW_CLOSE_SQUARE);
    if (cVar2 == '\0') {
      push_translation_error("expected \']\' here",translation_data);
      pAVar5 = get_error_tree((AST *)id);
      return (AST *)pAVar5;
    }
  } while( true );
}

Assistant:

struct AST* parse_postfix_expression(struct Translation_Data *translation_data,struct Scope *scope)
{
	
	struct AST *hold;
	struct AST *hold_expr;

	
	hold=parse_primary_expression(translation_data,scope);

	while(translation_data->tokens->size!=0)
	{
		switch(((struct token*)translation_data->tokens->first->data)->type)
		{
			case KW_PLUSPLUS:
				chomp(translation_data);
				hold=(struct AST*)get_unary_expression_tree(hold,OP_POSTFIX_INC);
				break;
			case KW_MINUSMINUS:
				chomp(translation_data);
				hold=(struct AST*)get_unary_expression_tree(hold,OP_POSTFIX_DEC);
				break;
			case KW_DOT:
				chomp(translation_data);
				if(check(translation_data,KW_ID,0))
				{
					hold=(struct AST*)get_binary_expression_tree(hold,(struct AST*)get_lvalue_expression_tree(Queue_Pop(translation_data->tokens),scope),OP_MEMBER);
				}
				break;
			case KW_ARROW:
				chomp(translation_data);
				if(check(translation_data,KW_ID,0))
				{
					hold=(struct AST*)get_binary_expression_tree(hold,(struct AST*)get_lvalue_expression_tree(Queue_Pop(translation_data->tokens),scope),OP_MEMBER_TROUGH_PTR);
				}
				break;
			case KW_OPEN_SQUARE:

				chomp(translation_data);
				if(get_and_check(translation_data,KW_CLOSE_SQUARE))
				{
					hold=(struct AST*)get_binary_expression_tree(hold,NULL,OP_ARR_SUBSCRIPT);
				}else
				{
					hold_expr=parse_expression(translation_data,scope);
					hold=(struct AST*)get_binary_expression_tree(hold,hold_expr,OP_ARR_SUBSCRIPT);
					if(!get_and_check(translation_data,KW_CLOSE_SQUARE))
					{
						push_translation_error("expected ']' here",translation_data);
						return (struct AST*)get_error_tree(hold);
					}
				}
				break;
			case KW_OPEN_NORMAL:
				chomp(translation_data);
				return (struct AST*)parse_arglist(translation_data,scope,hold);
				break;

			default:
				return hold;
		}
	}

	return hold;
}